

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O1

void EntityRelationTask::er_mixed_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  uint uVar6;
  v_array<unsigned_long> *extraout_RDX;
  v_array<unsigned_long> *pvVar7;
  v_array<unsigned_long> *extraout_RDX_00;
  v_array<unsigned_long> *extraout_RDX_01;
  int iVar8;
  ptag my_tag;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  undefined1 auVar14 [16];
  
  lVar3 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish +
          (1 - (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  auVar14._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar14._0_8_ = lVar3;
  auVar14._12_4_ = 0x45300000;
  dVar13 = (auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
    pvVar7 = extraout_RDX;
  }
  else {
    dVar13 = SQRT(dVar13);
    pvVar7 = predictions;
  }
  if ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar1 = (uint)(long)((dVar13 + -1.0) * 0.5);
    uVar9 = 0;
    do {
      iVar11 = (int)uVar9;
      if (uVar1 != 0) {
        uVar9 = 0;
        iVar12 = 0;
        iVar8 = uVar1 - 1;
        do {
          my_tag = (ptag)uVar9;
          if (iVar12 == iVar11) {
            sVar4 = predict_entity(sch,(ec->
                                       super__Vector_base<example_*,_std::allocator<example_*>_>).
                                       _M_impl.super__Vector_impl_data._M_start[uVar9],pvVar7,my_tag
                                   ,false);
            predictions->_begin[uVar9] = sVar4;
            pvVar7 = extraout_RDX_01;
            break;
          }
          iVar12 = iVar12 + 1;
          if (my_tag != 0) {
            uVar2 = 0;
            pvVar7 = (v_array<unsigned_long> *)0x0;
            iVar10 = iVar8;
            iVar5 = uVar1 * 2;
            do {
              iVar5 = iVar5 + -2;
              if (iVar11 == iVar12) {
                uVar2 = iVar10 + (uVar2 >> 1);
                sVar4 = predict_relation(sch,(ec->
                                             super__Vector_base<example_*,_std::allocator<example_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar2],
                                         predictions,uVar2,false);
                predictions->_begin[uVar2] = sVar4;
                pvVar7 = extraout_RDX_00;
                break;
              }
              uVar6 = (int)pvVar7 + 1;
              pvVar7 = (v_array<unsigned_long> *)(ulong)uVar6;
              iVar12 = iVar12 + 1;
              iVar10 = iVar10 + -1;
              uVar2 = uVar2 + iVar5;
            } while (my_tag != uVar6);
          }
          uVar9 = (ulong)(my_tag + 1);
          iVar8 = iVar8 + 1;
        } while (my_tag + 1 != uVar1);
      }
      uVar9 = (ulong)(iVar11 + 1);
    } while (uVar9 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void er_mixed_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions)
{
  // ec.size = #entity + #entity*(#entity-1)/2
  uint32_t n_ent = (uint32_t)((sqrt(ec.size() * 8 + 1) - 1) / 2);
  for (uint32_t t = 0; t < ec.size(); t++)
  {
    // Do entity recognition first
    uint32_t count = 0;
    for (ptag i = 0; i < n_ent; i++)
    {
      if (count == t)
      {
        predictions[i] = predict_entity(sch, ec[i], predictions, i);
        break;
      }
      count++;
      for (uint32_t j = 0; j < i; j++)
      {
        if (count == t)
        {
          ptag rel_index = (ptag)(n_ent + (2 * n_ent - j - 1) * j / 2 + i - j - 1);
          predictions[rel_index] = predict_relation(sch, ec[rel_index], predictions, rel_index);
          break;
        }
        count++;
      }
    }
  }
}